

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connecion.cpp
# Opt level: O0

void __thiscall
Markov::Connection::Output
          (Connection *this,string *name,ostream *ostr,optional<unsigned_long_long> maxgenLocal)

{
  pointer *this_00;
  uint uVar1;
  undefined8 uVar2;
  bool bVar3;
  MarkovExceptionTemplate<Markov::Exception::ConfigNotFoundM> *this_01;
  unsigned_long_long *puVar4;
  ChainSettings *pCVar5;
  element_type *peVar6;
  reference value;
  database_binder *binder;
  str_ref sql;
  unsigned_long_long local_490;
  long local_470;
  rowid_t res;
  string stringRes;
  unsigned_long_long n;
  anon_class_24_3_dfed711c outGet;
  uint i_1;
  rowid_t id;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  str_ref local_3d8;
  undefined1 local_3c8 [8];
  database_binder row;
  value_type_conflict2 local_390;
  undefined1 local_388 [8];
  MarkovDeque dq;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  str_ref local_2f8;
  undefined1 local_2e8 [8];
  database_binder dictStrPastm;
  undefined1 local_2a8 [8];
  database_binder pstm;
  string local_270;
  string local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  string local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  uint local_14c;
  undefined1 local_148 [4];
  int i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vec;
  string pstmString;
  unsigned_long_long maxgen;
  undefined1 local_f8 [8];
  optional<Markov::ChainSettings> conf;
  ostream *ostr_local;
  string *name_local;
  Connection *this_local;
  optional<unsigned_long_long> maxgenLocal_local;
  
  this_local = maxgenLocal.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long_long>._M_payload;
  maxgenLocal_local.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long_long>._M_payload._M_value._0_1_ =
       maxgenLocal.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long_long>._M_engaged;
  conf.super__Optional_base<Markov::ChainSettings,_false,_false>._M_payload.
  super__Optional_payload<Markov::ChainSettings,_true,_false,_false>.
  super__Optional_payload_base<Markov::ChainSettings>._192_8_ = ostr;
  GetConfig((optional<Markov::ChainSettings> *)local_f8,this,name);
  bVar3 = std::optional::operator_cast_to_bool((optional *)local_f8);
  if (!bVar3) {
    this_01 = (MarkovExceptionTemplate<Markov::Exception::ConfigNotFoundM> *)
              __cxa_allocate_exception(0x10);
    MarkovExceptionTemplate<Markov::Exception::ConfigNotFoundM>::MarkovExceptionTemplate(this_01);
    __cxa_throw(this_01,&
                        _ZTIN6Markov23MarkovExceptionTemplateIXadsoKcL_ZNS_9Exception15ConfigNotFoundMEEEEEE
                ,MarkovExceptionTemplate<Markov::Exception::ConfigNotFoundM>::
                 ~MarkovExceptionTemplate);
  }
  bVar3 = std::optional::operator_cast_to_bool((optional *)&this_local);
  if (bVar3) {
    puVar4 = std::optional<unsigned_long_long>::operator*
                       ((optional<unsigned_long_long> *)&this_local);
    local_490 = *puVar4;
  }
  else {
    pCVar5 = std::optional<Markov::ChainSettings>::operator->
                       ((optional<Markov::ChainSettings> *)local_f8);
    local_490 = pCVar5->maxgen;
  }
  std::__cxx11::string::string
            ((string *)
             &vec.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_148);
  for (local_14c = 1; uVar1 = local_14c,
      pCVar5 = std::optional<Markov::ChainSettings>::operator->
                         ((optional<Markov::ChainSettings> *)local_f8), uVar1 <= pCVar5->N;
      local_14c = local_14c + 1) {
    std::__cxx11::to_string(&local_1b0,local_14c);
    std::operator+(&local_190,"str",&local_1b0);
    std::operator+(&local_170,&local_190,"=?");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_148,&local_170);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_1b0);
  }
  pCVar5 = std::optional<Markov::ChainSettings>::operator->
                     ((optional<Markov::ChainSettings> *)local_f8);
  std::operator+(&local_230,"SELECT rstr FROM ",&pCVar5->sqlite_table);
  std::operator+(&local_210,&local_230," WHERE ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_270," AND ",(allocator<char> *)&pstm.field_0x2f);
  anon_unknown.dwarf_22748::joinStr
            (&local_250,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_148,&local_270);
  std::operator+(&local_1f0,&local_210,&local_250);
  std::operator+(&local_1d0,&local_1f0," ORDER BY RANDOM() LIMIT 1;");
  this_00 = &vec.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator((allocator<char> *)&pstm.field_0x2f);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_230);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_148);
  peVar6 = std::__shared_ptr_access<sqlite::database,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<sqlite::database,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)this);
  sql = (str_ref)std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
  dictStrPastm._40_8_ = sql._M_len;
  sqlite::database::operator<<((database_binder *)local_2a8,peVar6,sql);
  peVar6 = std::__shared_ptr_access<sqlite::database,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<sqlite::database,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)this);
  pCVar5 = std::optional<Markov::ChainSettings>::operator->
                     ((optional<Markov::ChainSettings> *)local_f8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &dq.super__Deque_base<long_long,_std::allocator<long_long>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_node,"SELECT str FROM ",
                 &pCVar5->sqlite_table_dict);
  std::operator+(&local_318,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &dq.super__Deque_base<long_long,_std::allocator<long_long>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_node," WHERE rowid=? LIMIT 1;");
  local_2f8 = (str_ref)std::__cxx11::string::operator_cast_to_basic_string_view
                                 ((string *)&local_318);
  sqlite::database::operator<<((database_binder *)local_2e8,peVar6,local_2f8);
  std::__cxx11::string::~string((string *)&local_318);
  std::__cxx11::string::~string
            ((string *)
             &dq.super__Deque_base<long_long,_std::allocator<long_long>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node);
  pCVar5 = std::optional<Markov::ChainSettings>::operator->
                     ((optional<Markov::ChainSettings> *)local_f8);
  uVar1 = pCVar5->N;
  local_390 = 0;
  std::allocator<long_long>::allocator((allocator<long_long> *)&row.field_0x2f);
  std::deque<long_long,_std::allocator<long_long>_>::deque
            ((deque<long_long,_std::allocator<long_long>_> *)local_388,(ulong)uVar1,&local_390,
             (allocator_type *)&row.field_0x2f);
  std::allocator<long_long>::~allocator((allocator<long_long> *)&row.field_0x2f);
  pCVar5 = std::optional<Markov::ChainSettings>::operator->
                     ((optional<Markov::ChainSettings> *)local_f8);
  if ((pCVar5->rndstart & 1U) != 0) {
    peVar6 = std::__shared_ptr_access<sqlite::database,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<sqlite::database,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)this);
    pCVar5 = std::optional<Markov::ChainSettings>::operator->
                       ((optional<Markov::ChainSettings> *)local_f8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&id,
                   "SELECT * FROM ",&pCVar5->sqlite_table);
    std::operator+(&local_3f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&id,
                   " ORDER BY RANDOM() LIMIT 1;");
    local_3d8 = (str_ref)std::__cxx11::string::operator_cast_to_basic_string_view
                                   ((string *)&local_3f8);
    sqlite::database::operator<<((database_binder *)local_3c8,peVar6,local_3d8);
    std::__cxx11::string::~string((string *)&local_3f8);
    std::__cxx11::string::~string((string *)&id);
    sqlite::operator>>((database_binder *)local_3c8,(longlong *)&stack0xfffffffffffffbe0);
    outGet.dq._4_4_ = 0;
    while( true ) {
      uVar1 = outGet.dq._4_4_;
      pCVar5 = std::optional<Markov::ChainSettings>::operator->
                         ((optional<Markov::ChainSettings> *)local_f8);
      if (pCVar5->N <= uVar1) break;
      value = std::deque<long_long,_std::allocator<long_long>_>::operator[]
                        ((deque<long_long,_std::allocator<long_long>_> *)local_388,
                         (ulong)outGet.dq._4_4_);
      sqlite::operator>>((database_binder *)local_3c8,value);
      outGet.dq._4_4_ = outGet.dq._4_4_ + 1;
    }
    sqlite::database_binder::~database_binder((database_binder *)local_3c8);
  }
  n = (unsigned_long_long)local_f8;
  outGet.conf = (optional<Markov::ChainSettings> *)local_2a8;
  outGet.pstm = (database_binder *)local_388;
  stringRes.field_2._8_8_ = 0;
  std::__cxx11::string::string((string *)&res);
  local_470 = Output::anon_class_24_3_dfed711c::operator()((anon_class_24_3_dfed711c *)&n);
  while (local_470 != 0) {
    binder = sqlite::operator<<((database_binder *)local_2e8,&local_470);
    sqlite::operator>>(binder,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &res);
    std::operator<<((ostream *)
                    conf.super__Optional_base<Markov::ChainSettings,_false,_false>._M_payload.
                    super__Optional_payload<Markov::ChainSettings,_true,_false,_false>.
                    super__Optional_payload_base<Markov::ChainSettings>._192_8_,(string *)&res);
    bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &res,"\n");
    uVar2 = conf.super__Optional_base<Markov::ChainSettings,_false,_false>._M_payload.
            super__Optional_payload<Markov::ChainSettings,_true,_false,_false>.
            super__Optional_payload_base<Markov::ChainSettings>._192_8_;
    if (bVar3) {
      pCVar5 = std::optional<Markov::ChainSettings>::operator->
                         ((optional<Markov::ChainSettings> *)local_f8);
      std::operator<<((ostream *)uVar2,(string *)&pCVar5->prefixmiddle);
    }
    if ((local_490 != 0) &&
       (stringRes.field_2._8_8_ = stringRes.field_2._8_8_ + 1, stringRes.field_2._8_8_ == local_490)
       ) break;
    anon_unknown.dwarf_22748::shiftDeque<long_long>
              ((deque<long_long,_std::allocator<long_long>_> *)local_388,&local_470);
    local_470 = Output::anon_class_24_3_dfed711c::operator()((anon_class_24_3_dfed711c *)&n);
  }
  std::__cxx11::string::~string((string *)&res);
  std::deque<long_long,_std::allocator<long_long>_>::~deque
            ((deque<long_long,_std::allocator<long_long>_> *)local_388);
  sqlite::database_binder::~database_binder((database_binder *)local_2e8);
  sqlite::database_binder::~database_binder((database_binder *)local_2a8);
  std::__cxx11::string::~string
            ((string *)
             &vec.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::optional<Markov::ChainSettings>::~optional((optional<Markov::ChainSettings> *)local_f8);
  return;
}

Assistant:

void Connection::Output(const std::string& name, std::ostream& ostr, std::optional<unsigned long long int> maxgenLocal) {
		auto conf = GetConfig(name);

		if (!conf) throw Exception::ConfigNotFound();
		unsigned long long int maxgen = (maxgenLocal ? (*maxgenLocal) : conf->maxgen);

		std::string pstmString;
			{
			std::vector<std::string> vec;

			for (int i = 1; i <= conf->N; ++i) {
					vec.push_back("str" + std::to_string(i) + "=?"); // All "base" strings
					}

			pstmString = "SELECT rstr FROM " + conf->sqlite_table + " WHERE " + joinStr(vec, " AND ") + " ORDER BY RANDOM() LIMIT 1;";
			}

		auto pstm = *db << pstmString;
		auto dictStrPastm = *db << "SELECT str FROM " + conf->sqlite_table_dict + " WHERE rowid=? LIMIT 1;";

		MarkovDeque dq(conf->N, 0);

		if (conf->rndstart) {
				auto row = *db << "SELECT * FROM " + conf->sqlite_table + " ORDER BY RANDOM() LIMIT 1;";
				rowid_t id;
				row >> id;

				for (unsigned int i = 0; i < conf->N; ++i) row >> dq[i];
				}

		auto outGet = [&conf, &pstm, &dq]() {
			for (size_t i = 0; i < conf->N; ++i) {
					pstm << dq.at(i);
					}

			rowid_t res = 0;
			pstm >> res;
			return res;
			};

		unsigned long long int n = 0;
		std::string stringRes;

		for (rowid_t res = outGet(); res != 0; res = outGet()) {
				dictStrPastm << res >> stringRes;
				ostr << stringRes;

				if (stringRes != "\n") ostr << conf->prefixmiddle;

				if (maxgen > 0 && ++n == maxgen) {
						return;
						}

				shiftDeque(dq, res);
				}
		}